

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lira_literal.h
# Opt level: O2

bool __thiscall
viras::
LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
::lim(LiraLiteral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
      *this,Infty i)

{
  PredSymbol PVar1;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  *pWVar2;
  bool bVar3;
  Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
  *pNVar4;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  WStack_68;
  WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
  local_40;
  
  PVar1 = this->symbol;
  if (PVar1 < Neq) {
    pNVar4 = &(this->term).oslp;
    if ((i.positive & 1U) == 0) {
      WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
      ::WithConfig(&WStack_68,
                   &pNVar4->
                    super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  );
      bVar3 = sugar::operator<((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                                *)&WStack_68,0);
      pWVar2 = &WStack_68;
    }
    else {
      WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
      ::WithConfig(&local_40,
                   &pNVar4->
                    super_WithConfig<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>,_Kernel::RationalConstantType>
                  );
      bVar3 = sugar::operator>((Numeral<viras::Config<Inferences::ALASCA::VampireVirasConfig<Kernel::NumTraits<Kernel::RationalConstantType>_>,_viras::DefaultOpts>_>
                                *)&local_40,0);
      pWVar2 = &local_40;
    }
    Kernel::RationalConstantType::~RationalConstantType(&pWVar2->inner);
  }
  else if (PVar1 == Neq) {
    bVar3 = true;
  }
  else {
    if (PVar1 != Eq) {
      do {
      } while( true );
    }
    bVar3 = false;
  }
  return bVar3;
}

Assistant:

bool lim(Infty i) const
    { 
      VIRAS_ASSERT(term.oslp != 0);
      switch (symbol) {
      case PredSymbol::Gt:
      case PredSymbol::Geq: return i.positive ? term.oslp > 0 
                                              : term.oslp < 0;
      case PredSymbol::Neq: return true;
      case PredSymbol::Eq: return false;
      }
      VIRAS_UNREACHABLE
    }